

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

uint32_t __thiscall duckdb::EncryptionTransport::Finalize(EncryptionTransport *this)

{
  uint uVar1;
  idx_t iVar2;
  ArenaChunk *pAVar3;
  EncryptionState *pEVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t total_length;
  data_t tag [16];
  data_t aes_buffer [4096];
  int local_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [4104];
  
  iVar2 = ArenaAllocator::SizeInBytes(&this->allocator);
  local_104c = (int)iVar2 + 0x1c;
  (*this->trans->_vptr_TTransport[9])(this->trans,&local_104c,4);
  (*this->trans->_vptr_TTransport[9])(this->trans,this->nonce,0xc);
  pAVar3 = ArenaAllocator::GetTail(&this->allocator);
  if (pAVar3 != (ArenaChunk *)0x0) {
    do {
      uVar6 = pAVar3->current_position;
      if (uVar6 != 0) {
        lVar5 = 0;
        uVar7 = 0;
        do {
          uVar6 = uVar6 + lVar5;
          if (0xfff < uVar6) {
            uVar6 = 0x1000;
          }
          pEVar4 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
          uVar1 = (*pEVar4->_vptr_EncryptionState[4])
                            (pEVar4,(pAVar3->data).pointer + uVar7,uVar6,local_1038,0x1000);
          (*this->trans->_vptr_TTransport[9])(this->trans,local_1038,(ulong)uVar1);
          uVar7 = uVar7 + 0x1000;
          uVar6 = pAVar3->current_position;
          lVar5 = lVar5 + -0x1000;
        } while (uVar7 < uVar6);
      }
      pAVar3 = pAVar3->prev;
    } while (pAVar3 != (ArenaChunk *)0x0);
  }
  pEVar4 = shared_ptr<duckdb::EncryptionState,_true>::operator->(&this->aes);
  uVar1 = (*pEVar4->_vptr_EncryptionState[5])(pEVar4,local_1038,0,local_1048,0x10);
  (*this->trans->_vptr_TTransport[9])(this->trans,local_1038,(ulong)uVar1);
  (*this->trans->_vptr_TTransport[9])(this->trans,local_1048,0x10);
  return local_104c + 4;
}

Assistant:

uint32_t Finalize() {
		// Write length
		const auto ciphertext_length = allocator.SizeInBytes();
		const uint32_t total_length = ParquetCrypto::NONCE_BYTES + ciphertext_length + ParquetCrypto::TAG_BYTES;

		trans.write(const_data_ptr_cast(&total_length), ParquetCrypto::LENGTH_BYTES);
		// Write nonce at beginning of encrypted chunk
		trans.write(nonce, ParquetCrypto::NONCE_BYTES);

		data_t aes_buffer[ParquetCrypto::CRYPTO_BLOCK_SIZE];
		auto current = allocator.GetTail();

		// Loop through the whole chunk
		while (current != nullptr) {
			for (idx_t pos = 0; pos < current->current_position; pos += ParquetCrypto::CRYPTO_BLOCK_SIZE) {
				auto next = MinValue<idx_t>(current->current_position - pos, ParquetCrypto::CRYPTO_BLOCK_SIZE);
				auto write_size =
				    aes->Process(current->data.get() + pos, next, aes_buffer, ParquetCrypto::CRYPTO_BLOCK_SIZE);
				trans.write(aes_buffer, write_size);
			}
			current = current->prev;
		}

		// Finalize the last encrypted data
		data_t tag[ParquetCrypto::TAG_BYTES];
		auto write_size = aes->Finalize(aes_buffer, 0, tag, ParquetCrypto::TAG_BYTES);
		trans.write(aes_buffer, write_size);
		// Write tag for verification
		trans.write(tag, ParquetCrypto::TAG_BYTES);

		return ParquetCrypto::LENGTH_BYTES + total_length;
	}